

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringVectorAttribute.cpp
# Opt level: O1

void __thiscall
Imf_3_4::
TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::readValueFrom(TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,IStream *is,int size,int version)

{
  _Alloc_hider _Var1;
  InputExc *this_00;
  int iVar2;
  char cVar3;
  int iVar4;
  string str;
  value_type local_50;
  
  if (0 < size) {
    iVar4 = 0;
    do {
      (*is->_vptr_IStream[3])(is,&local_50,4);
      _Var1._M_p = local_50._M_dataplus._M_p;
      if ((int)((uint)local_50._M_dataplus._M_p._3_1_ << 0x18) < 0) {
LAB_001a2f53:
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::InputExc::InputExc(this_00,"Invalid size field reading stringvector attribute");
        __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
      }
      iVar2 = (int)local_50._M_dataplus._M_p;
      if (size - (iVar4 + 4) < iVar2) goto LAB_001a2f53;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      cVar3 = (char)local_50._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::resize((ulong)&local_50,cVar3);
      if (0 < iVar2) {
        (*is->_vptr_IStream[3])(is,local_50._M_dataplus._M_p,(ulong)_Var1._M_p & 0xffffffff);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->_value,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      iVar4 = iVar4 + 4 + iVar2;
    } while (iVar4 < size);
  }
  return;
}

Assistant:

IMF_EXPORT void
StringVectorAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int read = 0;

    while (read < size)
    {
        int strSize;
        Xdr::read<StreamIO> (is, strSize);
        read += Xdr::size<int> ();

        // check there is enough space remaining in attribute to
        // contain claimed string length
        if (strSize < 0 || strSize > size - read)
        {
            throw IEX_NAMESPACE::InputExc (
                "Invalid size field reading stringvector attribute");
        }

        std::string str;
        str.resize (strSize);

        if (strSize > 0) { Xdr::read<StreamIO> (is, &str[0], strSize); }

        read += strSize;

        _value.push_back (str);
    }
}